

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sentencepiece_model.pb.h
# Opt level: O0

void __thiscall sentencepiece::TrainerSpec::set_unk_surface(TrainerSpec *this,string *value)

{
  Arena *pAVar1;
  MessageLite *in_RSI;
  long in_RDI;
  
  *(uint *)(in_RDI + 0x28) = *(uint *)(in_RDI + 0x28) | 8;
  pAVar1 = google::protobuf::MessageLite::GetArena(in_RSI);
  google::protobuf::internal::ArenaStringPtr::Set((ArenaStringPtr *)(in_RDI + 0xb0),in_RSI,pAVar1);
  return;
}

Assistant:

inline void TrainerSpec::set_unk_surface(std::string&& value) {
  _has_bits_[0] |= 0x00000008u;
  unk_surface_.Set(
    ::PROTOBUF_NAMESPACE_ID::internal::ArenaStringPtr::NonEmptyDefault{}, ::std::move(value), GetArena());
  // @@protoc_insertion_point(field_set_rvalue:sentencepiece.TrainerSpec.unk_surface)
}